

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sessions.c
# Opt level: O3

int cueify_device_read_sessions(cueify_device *d,cueify_sessions *s)

{
  int iVar1;
  
  if (s == (cueify_sessions *)0x0 || d == (cueify_device *)0x0) {
    return 3;
  }
  *(undefined4 *)(s + 1) = 0;
  *s = (cueify_sessions)0x0;
  iVar1 = cueify_device_read_sessions_unportable
                    ((cueify_device_private *)d,(cueify_sessions_private *)s);
  return iVar1;
}

Assistant:

int cueify_device_read_sessions(cueify_device *d, cueify_sessions *s) {
    cueify_device_private *dev = (cueify_device_private *)d;
    cueify_sessions_private *sessions = (cueify_sessions_private *)s;

    if (d == NULL || s == NULL) {
	return CUEIFY_ERR_BADARG;
    }

    memset(sessions, 0, sizeof(cueify_sessions_private));

    return cueify_device_read_sessions_unportable(dev, sessions);
}